

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsImplications.cpp
# Opt level: O2

void __thiscall
HighsImplications::cleanupVub
          (HighsImplications *this,HighsInt col,HighsInt vubCol,VarBound *vub,double ub,
          bool *redundant,bool *infeasible,bool allowBoundChanges)

{
  HighsMipSolverData *pHVar1;
  double dVar2;
  HighsCDouble HVar3;
  HighsDomainChange boundchg;
  HighsCDouble minub;
  HighsCDouble local_38;
  
  *redundant = false;
  *infeasible = false;
  if (vubCol != -1) {
    dVar2 = VarBound::maxValue(vub);
    local_38.hi = VarBound::minValue(vub);
    local_38.lo = 0.0;
    pHVar1 = (this->mipsolver->mipdata_)._M_t.
             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
             _M_t.
             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
             super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    if (ub - pHVar1->feastol <= local_38.hi) {
      *redundant = true;
    }
    else if (dVar2 <= pHVar1->epsilon + ub) {
      if (allowBoundChanges && dVar2 < ub - pHVar1->epsilon) {
        boundchg.boundval = dVar2 + 0.0;
        boundchg._8_8_ = (ulong)(uint)col + 0x100000000;
        HighsDomain::changeBound(&pHVar1->domain,boundchg,(Reason)0xfffffffe);
        *infeasible = (((this->mipsolver->mipdata_)._M_t.
                        super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                        .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->domain).
                      infeasible_;
      }
    }
    else {
      HVar3 = operator-(ub,&local_38);
      dVar2 = HVar3.lo + HVar3.hi;
      if (vub->coef <= 0.0) {
        vub->constant = ub;
        dVar2 = -dVar2;
      }
      vub->coef = dVar2;
    }
  }
  return;
}

Assistant:

void HighsImplications::cleanupVub(HighsInt col, HighsInt vubCol,
                                   HighsImplications::VarBound& vub, double ub,
                                   bool& redundant, bool& infeasible,
                                   bool allowBoundChanges) const {
  // initialize
  redundant = false;
  infeasible = false;

  // return if there is no variable bound
  if (vubCol == -1) return;

  // check variable upper bound
  mipsolver.mipdata_->debugSolution.checkVub(col, vubCol, vub.coef,
                                             vub.constant);

  HighsCDouble maxub = vub.maxValue();
  HighsCDouble minub = vub.minValue();

  if (minub >= ub - mipsolver.mipdata_->feastol) {
    // variable bound is redundant
    redundant = true;
  } else if (maxub > ub + mipsolver.mipdata_->epsilon) {
    // coefficient can be tightened
    double newcoef = static_cast<double>(ub - minub);
    if (vub.coef > 0) {
      vub.coef = newcoef;
    } else {
      vub.constant = ub;
      vub.coef = -newcoef;
    }
    // check tightened variable upper bound
    mipsolver.mipdata_->debugSolution.checkVub(col, vubCol, vub.coef,
                                               vub.constant);
  } else if (allowBoundChanges && maxub < ub - mipsolver.mipdata_->epsilon) {
    mipsolver.mipdata_->domain.changeBound(HighsBoundType::kUpper, col,
                                           static_cast<double>(maxub),
                                           HighsDomain::Reason::unspecified());
    infeasible = mipsolver.mipdata_->domain.infeasible();
  }
}